

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_line.cpp
# Opt level: O1

ON_3dVector * __thiscall ON_Triangle::Normal(ON_3dVector *__return_storage_ptr__,ON_Triangle *this)

{
  undefined1 auVar1 [16];
  double dVar2;
  ON_3dPoint from_pt;
  undefined8 uVar3;
  undefined8 uVar4;
  ulong uVar5;
  ON_3dPoint *pOVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  ON_3dVector W;
  ON_3dVector V;
  ON_3dVector local_78;
  ON_Line local_60;
  
  pOVar6 = this->m_V + 2;
  uVar11 = 0;
  uVar12 = 0xbff00000;
  uVar10 = 2;
  uVar7 = 0;
  uVar8 = 0;
  do {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar10;
    uVar9 = uVar8 + 1;
    uVar5 = (ulong)uVar9;
    if (uVar8 == 2) {
      uVar5 = 0;
    }
    uVar3 = this->m_V[uVar5].x;
    uVar4 = this->m_V[uVar5].y;
    from_pt.y = (double)uVar4;
    from_pt.x = (double)uVar3;
    from_pt.z = this->m_V[uVar5].z;
    ON_Line::ON_Line(&local_60,from_pt,
                     *(ON_3dPoint *)
                      ((long)pOVar6 +
                      (SUB168(auVar1 * ZEXT816(0xaaaaaaaaaaaaaaab),8) & 0x3ffffffffffffffe) * -0x24)
                    );
    ON_Line::Direction(&local_78,&local_60);
    ON_Line::~ON_Line(&local_60);
    dVar2 = ON_3dVector::MaximumCoordinate(&local_78);
    if ((double)CONCAT44(uVar12,uVar11) < dVar2) {
      uVar12 = (int)((ulong)dVar2 >> 0x20);
      uVar11 = SUB84(dVar2,0);
      uVar7 = uVar8;
    }
    pOVar6 = pOVar6 + 1;
    uVar10 = uVar10 + 1;
    uVar8 = uVar9;
  } while (uVar9 != 3);
  ON_3dPoint::operator-
            ((ON_3dVector *)&local_60,this->m_V + (int)(((int)(uVar7 + 1) / 3) * -3 + uVar7 + 1),
             this->m_V + (int)uVar7);
  ON_3dPoint::operator-
            (&local_78,this->m_V + (int)(((int)(uVar7 + 2) / 3) * -3 + uVar7 + 2),
             this->m_V + (int)uVar7);
  ON_CrossProduct(__return_storage_ptr__,(ON_3dVector *)&local_60,&local_78);
  return __return_storage_ptr__;
}

Assistant:

ON_3dVector ON_Triangle::Normal() const
{
	int i0 = 0; // base vetex for computation s/b opposite longest side
									 // too minimize roundoff 
									 // ( see Kahan https://people.eecs.berkeley.edu/~wkahan/MathH110/Cross.pdf).
	double max_len = -1;
	for (int i = 0; i < 3; i++)
	{
		ON_3dVector V = Edge(i).Direction();
		double normV = V.MaximumCoordinate();
		if (normV > max_len)
		{
			max_len = normV;
			i0 = i;
		}
	}

	ON_3dVector V = m_V[(i0 + 1)%3] - m_V[i0];
	ON_3dVector W = m_V[(i0 + 2)%3] - m_V[i0];

	return ON_CrossProduct(V, W);
}